

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Version::UpdateStats(Version *this,GetStats *stats)

{
  long lVar1;
  long lVar2;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RSI;
  if (((lVar2 == 0) || (*(int *)(lVar2 + 4) = *(int *)(lVar2 + 4) + -1, 0 < *(int *)(lVar2 + 4))) ||
     (*(long *)(in_RDI + 200) != 0)) {
    local_9 = false;
  }
  else {
    *(long *)(in_RDI + 200) = lVar2;
    *(int *)(in_RDI + 0xd0) = (int)in_RSI[1];
    local_9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool Version::UpdateStats(const GetStats& stats) {
  FileMetaData* f = stats.seek_file;
  if (f != nullptr) {
    f->allowed_seeks--;
    if (f->allowed_seeks <= 0 && file_to_compact_ == nullptr) {
      file_to_compact_ = f;
      file_to_compact_level_ = stats.seek_file_level;
      return true;
    }
  }
  return false;
}